

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O3

void Qentem::Test::TestRawVariableUTag4(QTest *test)

{
  QNumber64 QVar1;
  undefined4 uVar2;
  QTest *this;
  char16_t *pcVar3;
  Array<Qentem::Tags::TagBit> tags_cache;
  Value<char16_t> value;
  StringStream<char16_t> ss;
  QNumber64 local_a8;
  ulong uStack_a0;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_98;
  char local_88;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_78;
  undefined8 local_68;
  char16_t *local_60;
  undefined4 local_58;
  QTest *local_50;
  StringStream<char16_t> local_48;
  
  local_88 = '\0';
  local_48.storage_ = (char16_t *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_50 = test;
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.array_.storage_ = (Value<char16_t> *)local_a8;
  local_78.array_.index_ = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L">");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L">\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<\">");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<\'>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<&>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"&\"&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"\'\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'<\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'&\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<>&\'\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'\"<>&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<\"&\'>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<<<<<");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L">>>>>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"&&&&&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"\"\"\"\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'\'\'\'\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A<");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A>");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A&");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A\"");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L">A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"&A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\'A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A<A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A>A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A&A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A\"A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A\'A");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA<AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA>AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA&AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA\"AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA\'AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA<<<<AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA>>>>AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA&&&&AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA\"\"\"\"AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AA\'\'\'\'AA");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"<A>B\'C\"D&E\'F\"G<H>I&G\"K");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"AB\"CD\'EF<GH>IGK\'");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"\"ABC\'DEF<GHI>GK<");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_a8,L"A\"\"BC<<DE>>FG\'\'HI&&GK");
  if (local_88 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_98.array_);
    local_88 = '\x03';
  }
  local_78.number_ = local_a8;
  uVar2 = (undefined4)uStack_a0;
  uStack_a0 = uStack_a0 & 0xffffffff00000000;
  local_a8.Natural = 0;
  local_78.array_.index_ = uVar2;
  local_68 = CONCAT71(local_68._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_98.array_,(Value<char16_t> *)&local_78.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  QVar1 = local_a8;
  if ((void *)local_a8.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_a8);
  }
  operator_delete((void *)QVar1);
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:0}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:0}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  this = local_50;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (local_50,&local_48,(char16_t (*) [2])0x1355d2,0x648);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:1}";
  local_58 = 7;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:1}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (this,&local_48,(char16_t (*) [2])0x135572,0x64b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:2}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:2}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (this,&local_48,(char16_t (*) [2])0x13558a,0x64e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:3}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:3}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (this,&local_48,(char16_t (*) [2])0x1355f6,0x651);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:4}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:4}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (this,&local_48,(char16_t (*) [2])0x1361f6,0x654);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:5}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:5}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"<>",0x657);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:6}";
  local_58 = 7;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:6}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"<&",0x65a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:7}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:7}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"<&",0x65d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:8}";
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:8}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L">\"",0x660);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:9}";
  local_58 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:9}",7,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"\"\'",0x663);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:10}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:10}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"<\">",0x666);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:11}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:11}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"<\'>",0x669);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:12}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:12}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"<&>",0x66c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:13}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:13}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"&\"&",0x66f);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:14}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:14}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"\"\'\"",0x672);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:15}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:15}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"\'<\'",0x675);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:16}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:16}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"\'&\'",0x678);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:17}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:17}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"<>&\'\"",0x67b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:18}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:18}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"\'\"<>&",0x67e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:19}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:19}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"<\"&\'>",0x681);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:20}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:20}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"<<<<<",0x684);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:21}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:21}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L">>>>>",0x687);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:22}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:22}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"&&&&&",0x68a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:23}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:23}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"\"\"\"\"\"",0x68d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:24}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:24}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"\'\'\'\'\'",0x690);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:25}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:25}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"A<",0x693);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:26}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:26}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"A>",0x696);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:27}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:27}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"A&",0x699);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:28}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:28}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"A\"",0x69c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:29}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:29}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])L"A\'",0x69f);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:30}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:30}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])0x135626,0x6a2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:31}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:31}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])0x13562e,0x6a5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:32}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:32}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])0x135636,0x6a8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:33}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:33}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])0x13563e,0x6ab);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:34}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:34}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (this,&local_48,(char16_t (*) [3])0x135646,0x6ae);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:35}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:35}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"A<A",0x6b1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:36}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:36}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"A>A",0x6b4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:37}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:37}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"A&A",0x6b7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:38}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:38}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"A\"A",0x6ba);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:39}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:39}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (this,&local_48,(char16_t (*) [4])L"A\'A",0x6bd);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:40}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:40}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"AA<AA",0x6c0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:41}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:41}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"AA>AA",0x6c3);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:42}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:42}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"AA&AA",0x6c6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:43}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:43}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"AA\"AA",0x6c9);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:44}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:44}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (this,&local_48,(char16_t (*) [6])L"AA\'AA",0x6cc);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:45}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:45}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (this,&local_48,(char16_t (*) [9])L"AA<<<<AA",0x6cf);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:46}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:46}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (this,&local_48,(char16_t (*) [9])L"AA>>>>AA",0x6d2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:47}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:47}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (this,&local_48,(char16_t (*) [9])L"AA&&&&AA",0x6d5);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:48}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:48}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (this,&local_48,(char16_t (*) [9])L"AA\"\"\"\"AA",0x6d8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:49}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:49}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (this,&local_48,(char16_t (*) [9])L"AA\'\'\'\'AA",0x6db);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:50}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:50}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[23]>
            (this,&local_48,(char16_t (*) [23])L"<A>B\'C\"D&E\'F\"G<H>I&G\"K",0x6de);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:51}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:51}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (this,&local_48,(char16_t (*) [17])L"AB\"CD\'EF<GH>IGK\'",0x6e1);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:52}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:52}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[17]>
            (this,&local_48,(char16_t (*) [17])L"\"ABC\'DEF<GHI>GK<",0x6e4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_68 = 0;
  local_a8.Natural = 0;
  uStack_a0 = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_60 = L"{raw:53}";
  local_58 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{raw:53}",8,(Array<Qentem::Tags::TagBit> *)&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_78.array_,(Array<Qentem::Tags::TagBit> *)&local_a8,
             (Value<char16_t> *)&local_98.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[22]>
            (this,&local_48,(char16_t (*) [22])L"A\"\"BC<<DE>>FG\'\'HI&&GK",0x6e7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_98.array_);
  pcVar3 = local_48.storage_;
  if (local_48.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(pcVar3);
  return;
}

Assistant:

static void TestRawVariableUTag4(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value += uR"(<)";
    value += uR"(>)";
    value += uR"(&)";
    value += uR"(")";
    value += uR"(')";
    value += uR"(<>)";
    value += uR"(<&)";
    value += uR"(<&)";
    value += uR"(>")";
    value += uR"("')";
    value += uR"(<">)";
    value += uR"(<'>)";
    value += uR"(<&>)";
    value += uR"(&"&)";
    value += uR"("'")";
    value += uR"('<')";
    value += uR"('&')";
    value += uR"(<>&'")";
    value += uR"('"<>&)";
    value += uR"(<"&'>)";

    value += uR"(<<<<<)";
    value += uR"(>>>>>)";
    value += uR"(&&&&&)";
    value += uR"(""""")";
    value += uR"(''''')";

    value += uR"(A<)";
    value += uR"(A>)";
    value += uR"(A&)";
    value += uR"(A")";
    value += uR"(A')";
    value += uR"(<A)";
    value += uR"(>A)";
    value += uR"(&A)";
    value += uR"("A)";
    value += uR"('A)";
    value += uR"(A<A)";
    value += uR"(A>A)";
    value += uR"(A&A)";
    value += uR"(A"A)";
    value += uR"(A'A)";

    value += uR"(AA<AA)";
    value += uR"(AA>AA)";
    value += uR"(AA&AA)";
    value += uR"(AA"AA)";
    value += uR"(AA'AA)";

    value += uR"(AA<<<<AA)";
    value += uR"(AA>>>>AA)";
    value += uR"(AA&&&&AA)";
    value += uR"(AA""""AA)";
    value += uR"(AA''''AA)";

    value += uR"(<A>B'C"D&E'F"G<H>I&G"K)";
    value += uR"(AB"CD'EF<GH>IGK')";
    value += uR"("ABC'DEF<GHI>GK<)";
    value += uR"(A""BC<<DE>>FG''HI&&GK)";

    test.IsEqual(Template::Render(uR"({raw:0})", value, ss), uR"(<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:1})", value, ss), uR"(>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:2})", value, ss), uR"(&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:3})", value, ss), uR"(")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:4})", value, ss), uR"(')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:5})", value, ss), uR"(<>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:6})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:7})", value, ss), uR"(<&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:8})", value, ss), uR"(>")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:9})", value, ss), uR"("')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:10})", value, ss), uR"(<">)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:11})", value, ss), uR"(<'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:12})", value, ss), uR"(<&>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:13})", value, ss), uR"(&"&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:14})", value, ss), uR"("'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:15})", value, ss), uR"('<')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:16})", value, ss), uR"('&')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:17})", value, ss), uR"(<>&'")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:18})", value, ss), uR"('"<>&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:19})", value, ss), uR"(<"&'>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:20})", value, ss), uR"(<<<<<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:21})", value, ss), uR"(>>>>>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:22})", value, ss), uR"(&&&&&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:23})", value, ss), uR"(""""")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:24})", value, ss), uR"(''''')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:25})", value, ss), uR"(A<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:26})", value, ss), uR"(A>)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:27})", value, ss), uR"(A&)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:28})", value, ss), uR"(A")", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:29})", value, ss), uR"(A')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:30})", value, ss), uR"(<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:31})", value, ss), uR"(>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:32})", value, ss), uR"(&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:33})", value, ss), uR"("A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:34})", value, ss), uR"('A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:35})", value, ss), uR"(A<A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:36})", value, ss), uR"(A>A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:37})", value, ss), uR"(A&A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:38})", value, ss), uR"(A"A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:39})", value, ss), uR"(A'A)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:40})", value, ss), uR"(AA<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:41})", value, ss), uR"(AA>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:42})", value, ss), uR"(AA&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:43})", value, ss), uR"(AA"AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:44})", value, ss), uR"(AA'AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:45})", value, ss), uR"(AA<<<<AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:46})", value, ss), uR"(AA>>>>AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:47})", value, ss), uR"(AA&&&&AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:48})", value, ss), uR"(AA""""AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:49})", value, ss), uR"(AA''''AA)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:50})", value, ss), uR"(<A>B'C"D&E'F"G<H>I&G"K)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:51})", value, ss), uR"(AB"CD'EF<GH>IGK')", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:52})", value, ss), uR"("ABC'DEF<GHI>GK<)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({raw:53})", value, ss), uR"(A""BC<<DE>>FG''HI&&GK)", __LINE__);
    ss.Clear();
}